

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O2

void borg_cheat_store(void)

{
  char cVar1;
  object *obj;
  store_conflict *psVar2;
  borg_shop *pbVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  object **list;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  long lVar9;
  ulong uVar10;
  char *__s;
  ulong uVar11;
  undefined4 uVar12;
  long lVar13;
  long local_c0;
  char buf [120];
  
  list = (object **)mem_zalloc((ulong)z_info->store_inven_max << 3);
  lVar9 = 8;
  local_c0 = 0x68;
  uVar11 = 0;
  do {
    psVar2 = stores;
    if (z_info->store_max <= uVar11) {
      mem_free(list);
      return;
    }
    __s = borg_shops->ware[0].desc + lVar9 + -8;
    for (uVar10 = 0; uVar10 < z_info->store_inven_max; uVar10 = uVar10 + 1) {
      memset(__s,0,0x388);
      __s = __s + 0x388;
    }
    store_stock_list(psVar2 + uVar11,list,(uint)z_info->store_inven_max);
    lVar13 = local_c0;
    for (uVar10 = 0;
        (pbVar3 = borg_shops, uVar10 < z_info->store_inven_max &&
        (obj = list[uVar10], obj != (object *)0x0)); uVar10 = uVar10 + 1) {
      object_desc(buf,0x78,obj,7,player);
      iVar4 = bcmp(buf,"(nothing)",10);
      if (iVar4 == 0) break;
      borg_item_analyze((borg_item *)(pbVar3->ware[0].desc + lVar13 + -0x68),obj,buf,uVar11 != 7);
      if (uVar11 == 0) {
        cVar1 = pbVar3->ware[0].desc[lVar13 + -8];
        if (cVar1 == '\x13') {
          wVar5 = (wchar_t)borg_items[(ulong)z_info->pack_size + 5].sval;
          pwVar7 = &borg_fuel_onsale;
          pwVar8 = &sv_light_torch;
        }
        else if (cVar1 == '\x1b') {
          wVar5 = (wchar_t)borg_items[(ulong)z_info->pack_size + 5].sval;
          pwVar7 = &borg_fuel_onsale;
          pwVar8 = &sv_light_lantern;
        }
        else {
          if (cVar1 != '\x1c') goto LAB_001ee562;
          wVar5 = (wchar_t)(byte)pbVar3->ware[0].desc[lVar13 + -7];
          pwVar7 = &borg_food_onsale;
          pwVar8 = &sv_food_ration;
        }
        if (*pwVar8 == wVar5) {
          *pwVar7 = (uint)(byte)pbVar3->ware[0].desc[lVar13 + -4];
        }
      }
LAB_001ee562:
      uVar12 = 0;
      if (f_info[0xe].shopnum - 1 != uVar11) {
        tval_can_have_charges(obj);
        wVar5 = object_value_real(obj,L'\x01');
        wVar6 = object_value(obj,L'\x01');
        if (wVar6 < wVar5) {
          wVar5 = object_value(obj,L'\x01');
        }
        else {
          wVar5 = object_value_real(obj,L'\x01');
        }
        if (L'\0' < wVar5) {
          iVar4 = 100;
          if (f_info[0xd].shopnum - 1 == uVar11) {
            iVar4 = 0x96;
          }
          tval_can_have_charges(obj);
          wVar5 = object_value_real(obj,L'\x01');
          iVar4 = (wVar5 << (f_info[0xd].shopnum - 1 == uVar11)) * iVar4;
          tval_can_have_charges(obj);
          uVar12 = (undefined4)(((long)iVar4 + 0x32) / 100);
          if (iVar4 < 0x32) {
            uVar12 = 1;
          }
        }
      }
      *(undefined4 *)(pbVar3->ware[0].desc + lVar13 + 0x18) = uVar12;
      lVar13 = lVar13 + 0x388;
    }
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x54c8;
    local_c0 = local_c0 + 0x54c8;
  } while( true );
}

Assistant:

void borg_cheat_store(void)
{
    int             slot, i;
    int             store_num;
    struct object*  o_ptr;
    struct object** list
        = mem_zalloc(sizeof(struct object*) * z_info->store_inven_max);

    /* Scan each store */
    for (store_num = 0; store_num < z_info->store_max; store_num++) {
        struct store* st_ptr = &stores[store_num];

        /* Clear the Inventory from memory */
        for (i = 0; i < z_info->store_inven_max; i++) {
            /* Wipe the ware */
            memset(&borg_shops[store_num].ware[i], 0, sizeof(borg_item));
        }

        store_stock_list(st_ptr, list, z_info->store_inven_max);

        /* Check each existing object in this store */
        for (slot = 0; slot < z_info->store_inven_max && list[slot]; slot++) {
            o_ptr             = list[slot];
            borg_item* b_item = &borg_shops[store_num].ware[slot];
            char       buf[120];

            /* Describe the item */
            object_desc(
                buf, sizeof(buf), o_ptr, ODESC_FULL | ODESC_STORE, player);
            if (streq(buf, "(nothing)"))
                break;

            /* Analyze the item */
            borg_item_analyze(
                b_item, o_ptr, buf, store_num == 7 ? false : true);

            /* Check if the general store has certain items */
            if (store_num == 0) {
                /* Food -- needed for money scumming */
                if (b_item->tval == TV_FOOD && b_item->sval == sv_food_ration)
                    borg_food_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_FLASK
                    && borg_items[INVEN_LIGHT].sval == sv_light_lantern)
                    borg_fuel_onsale = b_item->iqty;

                /* Fuel for lanterns */
                if (b_item->tval == TV_LIGHT
                    && borg_items[INVEN_LIGHT].sval == sv_light_torch)
                    borg_fuel_onsale = b_item->iqty;
            }

            /* Hack -- Save the declared cost */
            b_item->cost = borg_price_item(o_ptr, false, 1, store_num);
        }
    }
    mem_free(list);
}